

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O3

void CPU::WDC65816::ProcessorStorageConstructor::absolute_long_jsl
               (AccessType param_1,bool param_2,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  MicroOp local_12 [10];
  
  local_12[0] = CycleFetchIncrementPC;
  if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*target->_M_invoker)((_Any_data *)target,local_12);
    local_12[1] = 0;
    if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*target->_M_invoker)((_Any_data *)target,local_12 + 1);
      local_12[2] = 0x33;
      if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
        (*target->_M_invoker)((_Any_data *)target,local_12 + 2);
        local_12[3] = 0x17;
        if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
          (*target->_M_invoker)((_Any_data *)target,local_12 + 3);
          local_12[4] = 4;
          if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
            (*target->_M_invoker)((_Any_data *)target,local_12 + 4);
            local_12[5] = 1;
            if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
              (*target->_M_invoker)((_Any_data *)target,local_12 + 5);
              local_12[6] = 0x1a;
              if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
                (*target->_M_invoker)((_Any_data *)target,local_12 + 6);
                local_12[7] = 0x2e;
                if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
                  (*target->_M_invoker)((_Any_data *)target,local_12 + 7);
                  local_12[8] = 0x17;
                  if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
                    (*target->_M_invoker)((_Any_data *)target,local_12 + 8);
                    local_12[9] = 0x17;
                    if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
                      (*target->_M_invoker)((_Any_data *)target,local_12 + 9);
                      return;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::__throw_bad_function_call();
}

Assistant:

static void absolute_long_jsl(AccessType, bool, const std::function<void(MicroOp)> &target) {
		target(CycleFetchIncrementPC);			// New PCL.
		target(CycleFetchIncrementPC);			// New PCH.

		target(OperationCopyPBRToData);			// Copy PBR to the data register.
		target(CyclePushNotEmulation);			// PBR.
		target(CycleFetchPreviousThrowaway);	// IO.

		target(CycleFetchPC);					// New PBR.

		target(OperationConstructAbsolute);		// Calculate data address.
		target(OperationPerform);				// [JSL]

		target(CyclePushNotEmulation);			// PCH.
		target(CyclePushNotEmulation);			// PCL.
	}